

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

bool __thiscall hdc::Logger::enabled(Logger *this,LogKind kind)

{
  char cVar1;
  bool bVar2;
  
  bVar2 = true;
  switch(kind) {
  case LOG_ERROR:
    goto switchD_00170a5d_caseD_0;
  default:
    goto switchD_00170a5d_caseD_1;
  case LOG_INTERNAL_DRIVER:
    cVar1 = this->logDriverFlag;
    break;
  case LOG_INTERNAL_LEX:
    cVar1 = this->logLexFlag;
    break;
  case LOG_INTERNAL_PARSER:
    cVar1 = this->logParserFlag;
    goto joined_r0x00170a7c;
  case LOG_INTERNAL_SYMBOL_TABLE:
    cVar1 = this->logSymbolTableFlag;
joined_r0x00170a7c:
    if (cVar1 != '\0') {
      return true;
    }
    goto switchD_00170a5d_caseD_1;
  }
  if (cVar1 == '\0') {
switchD_00170a5d_caseD_1:
    bVar2 = false;
  }
switchD_00170a5d_caseD_0:
  return bVar2;
}

Assistant:

bool Logger::enabled(LogKind kind) {
    if (kind == LOG_ERROR) return true;
    if (kind == LOG_INTERNAL_DRIVER && logDriverFlag) return true;
    if (kind == LOG_INTERNAL_LEX && logLexFlag) return true;
    if (kind == LOG_INTERNAL_PARSER && logParserFlag) return true;
    if (kind == LOG_INTERNAL_SYMBOL_TABLE && logSymbolTableFlag) return true;

    return false;
}